

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O3

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)

{
  SUNMemoryHelper pSVar1;
  SUNMemoryHelper_Ops pSVar2;
  
  if (sunctx == (SUNContext)0x0) {
    pSVar1 = (SUNMemoryHelper)0x0;
  }
  else {
    pSVar1 = (SUNMemoryHelper)malloc(0x18);
    pSVar2 = (SUNMemoryHelper_Ops)calloc(1,0x38);
    pSVar1->ops = pSVar2;
    pSVar1->content = (void *)0x0;
    pSVar1->sunctx = sunctx;
  }
  return pSVar1;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)
{
  if (sunctx == NULL) { return NULL; }

  SUNFunctionBegin(sunctx);
  SUNMemoryHelper helper = NULL;

  helper = (SUNMemoryHelper)malloc(sizeof(struct SUNMemoryHelper_));
  SUNAssertNull(helper, SUN_ERR_MALLOC_FAIL);

  helper->ops = (SUNMemoryHelper_Ops)malloc(sizeof(struct SUNMemoryHelper_Ops_));
  SUNAssertNull(helper->ops, SUN_ERR_MALLOC_FAIL);

  /* Set all ops to NULL */
  memset(helper->ops, 0, sizeof(struct SUNMemoryHelper_Ops_));
  helper->content = NULL;
  helper->sunctx  = sunctx;

  return helper;
}